

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

uint __thiscall UnifiedRegex::CharSetInner::Count(CharSetInner *this,uint level)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  uint i;
  long lVar6;
  uint uVar7;
  
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x281,"(level > 0)","level > 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  uVar7 = 0;
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    pCVar1 = this->children[lVar6];
    if (pCVar1 != (CharSetNode *)0x0) {
      iVar4 = (*pCVar1->_vptr_CharSetNode[0xb])(pCVar1,(ulong)(level - 1));
      uVar7 = uVar7 + iVar4;
    }
  }
  return uVar7;
}

Assistant:

uint CharSetInner::Count(uint level) const
    {
        uint n = 0;
        Assert(level >  0);
        level--;
        for (uint i = 0; i < branchingPerInnerLevel; i++)
        {
            if (children[i] != nullptr)
                n += children[i]->Count(level);
        }
        return n;
    }